

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::Parse(Parser *this,Tokenizer *input,FileDescriptorProto *file)

{
  bool bVar1;
  LogMessage *pLVar2;
  SourceCodeInfo *other;
  byte bVar3;
  LogFinisher local_b1;
  LocationRecorder root_location;
  LogMessage local_98;
  SourceCodeInfo source_code_info;
  
  this->input_ = input;
  this->had_errors_ = false;
  (this->syntax_identifier_)._M_string_length = 0;
  *(this->syntax_identifier_)._M_dataplus._M_p = '\0';
  SourceCodeInfo::SourceCodeInfo(&source_code_info);
  this->source_code_info_ = &source_code_info;
  if ((this->input_->current_).type == TYPE_START) {
    io::Tokenizer::NextWithComments
              (this->input_,(string *)0x0,&this->upcoming_detached_comments_,
               &this->upcoming_doc_comments_);
  }
  LocationRecorder::LocationRecorder(&root_location,this);
  LocationRecorder::RecordLegacyLocation(&root_location,&file->super_Message,OTHER);
  if (this->require_syntax_identifier_ == false) {
    bVar1 = LookingAt(this,"syntax");
    if (bVar1) goto LAB_0031fe6e;
    if (this->stop_after_syntax_identifier_ == false) {
      internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_WARNING,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/parser.cc"
                 ,0x286);
      pLVar2 = internal::LogMessage::operator<<
                         (&local_98,"No syntax specified for the proto file: ");
      pLVar2 = internal::LogMessage::operator<<(pLVar2,(file->name_).ptr_);
      pLVar2 = internal::LogMessage::operator<<(pLVar2,". Please use \'syntax = \"proto2\";\' ");
      pLVar2 = internal::LogMessage::operator<<
                         (pLVar2,"or \'syntax = \"proto3\";\' to specify a syntax ");
      pLVar2 = internal::LogMessage::operator<<(pLVar2,"version. (Defaulted to proto2 syntax.)");
      internal::LogFinisher::operator=(&local_b1,pLVar2);
      internal::LogMessage::~LogMessage(&local_98);
      std::__cxx11::string::assign((char *)&this->syntax_identifier_);
    }
LAB_0031ff35:
    if (this->stop_after_syntax_identifier_ == false) {
      pLVar2 = &local_98;
      while ((this->input_->current_).type != TYPE_END) {
        bVar1 = ParseTopLevelStatement(this,file,&root_location);
        if (!bVar1) {
          SkipStatement(this);
          bVar1 = LookingAt(this,"}");
          if (bVar1) {
            std::__cxx11::string::string((string *)pLVar2,"Unmatched \"}\".",(allocator *)&local_b1)
            ;
            AddError(this,(string *)pLVar2);
            std::__cxx11::string::~string((string *)pLVar2);
            io::Tokenizer::NextWithComments
                      (this->input_,(string *)0x0,&this->upcoming_detached_comments_,
                       &this->upcoming_doc_comments_);
          }
        }
      }
      bVar1 = true;
      goto LAB_0031ffce;
    }
    pLVar2 = (LogMessage *)(ulong)(this->had_errors_ ^ 1);
  }
  else {
LAB_0031fe6e:
    bVar1 = ParseSyntaxIdentifier(this,&root_location);
    if (bVar1) {
      if (file != (FileDescriptorProto *)0x0) {
        FileDescriptorProto::_internal_set_syntax(file,&this->syntax_identifier_);
      }
      goto LAB_0031ff35;
    }
    pLVar2 = (LogMessage *)0x0;
  }
  bVar1 = false;
LAB_0031ffce:
  bVar3 = (byte)pLVar2;
  LocationRecorder::~LocationRecorder(&root_location);
  if (bVar1) {
    this->input_ = (Tokenizer *)0x0;
    this->source_code_info_ = (SourceCodeInfo *)0x0;
    other = FileDescriptorProto::_internal_mutable_source_code_info(file);
    SourceCodeInfo::Swap(&source_code_info,other);
    bVar3 = this->had_errors_ ^ 1;
  }
  SourceCodeInfo::~SourceCodeInfo(&source_code_info);
  return (bool)(bVar3 & 1);
}

Assistant:

bool Parser::Parse(io::Tokenizer* input, FileDescriptorProto* file) {
  input_ = input;
  had_errors_ = false;
  syntax_identifier_.clear();

  // Note that |file| could be NULL at this point if
  // stop_after_syntax_identifier_ is true.  So, we conservatively allocate
  // SourceCodeInfo on the stack, then swap it into the FileDescriptorProto
  // later on.
  SourceCodeInfo source_code_info;
  source_code_info_ = &source_code_info;

  if (LookingAtType(io::Tokenizer::TYPE_START)) {
    // Advance to first token.
    input_->NextWithComments(NULL, &upcoming_detached_comments_,
                             &upcoming_doc_comments_);
  }

  {
    LocationRecorder root_location(this);
    root_location.RecordLegacyLocation(file,
                                       DescriptorPool::ErrorCollector::OTHER);

    if (require_syntax_identifier_ || LookingAt("syntax")) {
      if (!ParseSyntaxIdentifier(root_location)) {
        // Don't attempt to parse the file if we didn't recognize the syntax
        // identifier.
        return false;
      }
      // Store the syntax into the file.
      if (file != NULL) file->set_syntax(syntax_identifier_);
    } else if (!stop_after_syntax_identifier_) {
      GOOGLE_LOG(WARNING) << "No syntax specified for the proto file: " << file->name()
                   << ". Please use 'syntax = \"proto2\";' "
                   << "or 'syntax = \"proto3\";' to specify a syntax "
                   << "version. (Defaulted to proto2 syntax.)";
      syntax_identifier_ = "proto2";
    }

    if (stop_after_syntax_identifier_) return !had_errors_;

    // Repeatedly parse statements until we reach the end of the file.
    while (!AtEnd()) {
      if (!ParseTopLevelStatement(file, root_location)) {
        // This statement failed to parse.  Skip it, but keep looping to parse
        // other statements.
        SkipStatement();

        if (LookingAt("}")) {
          AddError("Unmatched \"}\".");
          input_->NextWithComments(NULL, &upcoming_detached_comments_,
                                   &upcoming_doc_comments_);
        }
      }
    }
  }

  input_ = NULL;
  source_code_info_ = NULL;
  assert(file != NULL);
  source_code_info.Swap(file->mutable_source_code_info());
  return !had_errors_;
}